

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void TestAll(void)

{
  TestRunner tr;
  allocator<char> local_2d;
  TestRunner local_2c;
  string local_28;
  
  local_2c.fail_count = 0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"TestParseEvent",&local_2d)
  ;
  TestRunner::RunTest<void(*)()>(&local_2c,TestParseEvent,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"TestParseCondition",&local_2d);
  TestRunner::RunTest<void(*)()>(&local_2c,TestParseCondition,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  TestRunner::~TestRunner(&local_2c);
  return;
}

Assistant:

void TestParseEvent() {
    {
        istringstream is("event");
        AssertEqual(ParseEvent(is), "event", "Parse event without leading spaces");
    }
    {
        istringstream is("   sport event ");
        AssertEqual(ParseEvent(is), "sport event ", "Parse event with leading spaces");
    }
    {
        istringstream is("  first event  \n  second event");
        vector<string> events;
        events.push_back(ParseEvent(is));
        events.push_back(ParseEvent(is));
        AssertEqual(events, vector<string>{"first event  ", "second event"}, "Parse multiple events");
    }
}